

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::ban_ip(session_impl *this,address *addr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar1;
  torrent *this_01;
  ip_filter *piVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer psVar4;
  undefined1 local_49;
  shared_ptr<const_libtorrent::ip_filter> local_48;
  ip_filter *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  if ((this->m_ip_filter).super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_38 = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libtorrent::ip_filter,std::allocator<libtorrent::ip_filter>>
              (&_Stack_30,&local_38,(allocator<libtorrent::ip_filter> *)&local_49);
    _Var3._M_pi = _Stack_30._M_pi;
    piVar2 = local_38;
    local_38 = (ip_filter *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->m_ip_filter).
              super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->m_ip_filter).super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = piVar2;
    (this->m_ip_filter).super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  ip_filter::add_rule((this->m_ip_filter).
                      super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      addr,addr,1);
  psVar4 = (this->m_torrents).m_array.
           super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_torrents).m_array.
           super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar1) {
    do {
      this_01 = (psVar4->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      local_48.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->m_ip_filter).super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_48.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this->m_ip_filter).super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_48.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_48.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_48.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      torrent::set_ip_filter(this_01,&local_48);
      if (local_48.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.
                   super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  return;
}

Assistant:

void session_impl::ban_ip(address addr)
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_ip_filter) m_ip_filter = std::make_shared<ip_filter>();
		m_ip_filter->add_rule(addr, addr, ip_filter::blocked);
		for (auto& i : m_torrents)
			i->set_ip_filter(m_ip_filter);
	}